

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O0

unique_ptr<SequenceReader<Protein>,_std::default_delete<SequenceReader<Protein>_>_>
DetectFileFormatAndOpenReader<Protein>(string *path,FileFormat defaultFormat)

{
  FileFormat FVar1;
  pointer __p;
  Reader<Protein> *this;
  FileFormat in_EDX;
  undefined4 in_register_00000034;
  string *filepath;
  FileFormat defaultFormat_local;
  string *path_local;
  
  filepath = (string *)CONCAT44(in_register_00000034,defaultFormat);
  FVar1 = InferFileFormat(filepath,in_EDX);
  if (FVar1 == FASTQ) {
    __p = (pointer)operator_new(0x10);
    FASTQ::Reader<Protein>::SequenceReader((Reader<Protein> *)__p,filepath);
    std::unique_ptr<SequenceReader<Protein>,std::default_delete<SequenceReader<Protein>>>::
    unique_ptr<std::default_delete<SequenceReader<Protein>>,void>
              ((unique_ptr<SequenceReader<Protein>,std::default_delete<SequenceReader<Protein>>> *)
               path,__p);
  }
  else {
    this = (Reader<Protein> *)operator_new(0x30);
    FASTA::Reader<Protein>::SequenceReader(this,filepath);
    std::unique_ptr<SequenceReader<Protein>,std::default_delete<SequenceReader<Protein>>>::
    unique_ptr<std::default_delete<SequenceReader<Protein>>,void>
              ((unique_ptr<SequenceReader<Protein>,std::default_delete<SequenceReader<Protein>>> *)
               path,(pointer)this);
  }
  return (__uniq_ptr_data<SequenceReader<Protein>,_std::default_delete<SequenceReader<Protein>_>,_true,_true>
          )(__uniq_ptr_data<SequenceReader<Protein>,_std::default_delete<SequenceReader<Protein>_>,_true,_true>
            )path;
}

Assistant:

static std::unique_ptr< SequenceReader < A > > DetectFileFormatAndOpenReader( const std::string &path, const FileFormat defaultFormat ) {
  switch( InferFileFormat( path, defaultFormat ) ) {
    case FileFormat::FASTQ:
      return std::unique_ptr< SequenceReader< A > >(
        new FASTQ::Reader< A >( path ) );

    default:
      return std::unique_ptr< SequenceReader< A > >(
        new FASTA::Reader< A >( path ) );
  }
}